

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-conv.c
# Opt level: O0

size_t ucs2_bytelen(char *str,ssize_t max_sz)

{
  bool bVar1;
  char *local_28;
  char *p;
  ssize_t max_sz_local;
  char *str_local;
  
  if ((str == (char *)0x0) || (max_sz == 0)) {
    str_local = (char *)0x0;
  }
  else {
    local_28 = str;
    if (max_sz == 1) {
      str_local = (char *)0x1;
    }
    else {
      do {
        bVar1 = true;
        if (*local_28 == '\0') {
          bVar1 = local_28[1] != '\0';
        }
        if (!bVar1) {
          return (size_t)(local_28 + -(long)str);
        }
        local_28 = local_28 + 2;
      } while ((max_sz < 0) ||
              (str_local = (char *)max_sz, (long)(local_28 + (1 - (long)str)) < max_sz));
    }
  }
  return (size_t)str_local;
}

Assistant:

size_t
ucs2_bytelen   (const char   *str,
                ssize_t       max_sz)
{
    char *p = (char *) str;

    if (str == NULL || max_sz == 0)
        return 0;

    if (max_sz == 1)
        return 1;

    while (*p || *(p+1))
    {
        p += 2;
        if (max_sz >= 0 && p - str + 1 >= max_sz)
            return max_sz;
    }
    return p - str;
}